

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O3

FT_Error tt_get_advances(FT_Face ttface,FT_UInt start,FT_UInt count,FT_Int32 flags,
                        FT_Fixed *advances)

{
  ulong in_RAX;
  ulong uVar1;
  FT_UShort aw;
  FT_UShort ah;
  FT_Short lsb;
  FT_Short tsb;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if ((flags & 0x10U) == 0) {
    if ((((ttface->face_index & 0x7fff0000U) != 0) || ((ttface->face_flags & 0x8000) != 0)) &&
       (((ulong)ttface[4].extensions & 2) == 0)) {
      return 7;
    }
    if (count != 0) {
      uVar1 = 0;
      do {
        (**(code **)(*(long *)&ttface[3].units_per_EM + 0x140))
                  (ttface,0,start + (int)uVar1,(long)&local_38 + 4,&local_38);
        advances[uVar1] = local_38 & 0xffff;
        uVar1 = uVar1 + 1;
      } while (count != uVar1);
    }
  }
  else {
    if ((((ttface->face_index & 0x7fff0000U) != 0) || ((ttface->face_flags & 0x8000) != 0)) &&
       (((ulong)ttface[4].extensions & 0x10) == 0)) {
      return 7;
    }
    if (count != 0) {
      uVar1 = 0;
      do {
        TT_Get_VMetrics((TT_Face)ttface,start + (int)uVar1,0,(FT_Short *)((long)&local_38 + 6),
                        (FT_UShort *)((long)&local_38 + 2));
        advances[uVar1] = local_38 >> 0x10 & 0xffff;
        uVar1 = uVar1 + 1;
      } while (count != uVar1);
    }
  }
  return 0;
}

Assistant:

static FT_Error
  tt_get_advances( FT_Face    ttface,
                   FT_UInt    start,
                   FT_UInt    count,
                   FT_Int32   flags,
                   FT_Fixed  *advances )
  {
    FT_UInt  nn;
    TT_Face  face = (TT_Face)ttface;


    /* XXX: TODO: check for sbits */

    if ( flags & FT_LOAD_VERTICAL_LAYOUT )
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* no fast retrieval for blended MM fonts without VVAR table */
      if ( ( FT_IS_NAMED_INSTANCE( ttface ) || FT_IS_VARIATION( ttface ) ) &&
           !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )        )
        return FT_THROW( Unimplemented_Feature );
#endif

      for ( nn = 0; nn < count; nn++ )
      {
        FT_Short   tsb;
        FT_UShort  ah;


        /* since we don't need `tsb', we use zero for `yMax' parameter */
        TT_Get_VMetrics( face, start + nn, 0, &tsb, &ah );
        advances[nn] = ah;
      }
    }
    else
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* no fast retrieval for blended MM fonts without HVAR table */
      if ( ( FT_IS_NAMED_INSTANCE( ttface ) || FT_IS_VARIATION( ttface ) ) &&
           !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )        )
        return FT_THROW( Unimplemented_Feature );
#endif

      for ( nn = 0; nn < count; nn++ )
      {
        FT_Short   lsb;
        FT_UShort  aw;


        TT_Get_HMetrics( face, start + nn, &lsb, &aw );
        advances[nn] = aw;
      }
    }

    return FT_Err_Ok;
  }